

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_main.c
# Opt level: O1

wchar_t assertion_entry_compare_acls
                  (char *file,wchar_t line,archive_entry *ae,archive_test_acl_t *acls,wchar_t cnt,
                  wchar_t want_type,wchar_t mode)

{
  bool bVar1;
  wchar_t wVar2;
  wchar_t wVar3;
  wchar_t wVar4;
  int iVar5;
  mode_t mVar6;
  ulong uVar7;
  archive_test_acl_t *paVar8;
  int *piVar9;
  char *pcVar10;
  long lVar11;
  ulong uVar12;
  uint uVar13;
  int iVar14;
  bool bVar15;
  wchar_t local_94;
  wchar_t permset;
  wchar_t local_84;
  wchar_t local_80;
  wchar_t qual;
  wchar_t tag;
  wchar_t type;
  archive_entry *local_70;
  int *local_68;
  uint local_60;
  uint local_5c;
  uint local_58;
  uint local_54;
  uint local_50;
  wchar_t local_4c;
  char *name;
  char *local_40;
  ulong local_38;
  
  assertions = assertions + L'\x01';
  msg = nextmsg;
  nextmsg = (char *)0x0;
  local_68 = (int *)malloc((long)cnt * 4);
  if (cnt < L'\x01') {
    iVar14 = 0;
  }
  else {
    uVar7 = 0;
    iVar14 = 0;
    paVar8 = acls;
    do {
      if ((paVar8->type & want_type) != 0) {
        local_68[iVar14] = (int)uVar7;
        iVar14 = iVar14 + 1;
      }
      uVar7 = uVar7 + 1;
      paVar8 = paVar8 + 1;
    } while ((uint)cnt != uVar7);
  }
  if (iVar14 == 0) {
    failure_start(file,line,"No ACL\'s to compare, type mask: %d",(ulong)(uint)want_type);
    local_94 = L'\x01';
  }
  else {
    local_84 = mode & 7;
    local_58 = mode & 0x38;
    local_60 = (uint)mode >> 3 & 7;
    local_54 = mode & 0x1c0;
    local_5c = (uint)mode >> 6 & 7;
    local_94 = L'\0';
    local_80 = want_type;
    local_70 = ae;
LAB_0011842a:
    while (wVar4 = archive_entry_acl_next(ae,want_type,&type,&permset,&tag,&qual,&name),
          wVar3 = type, wVar2 = permset, wVar4 == L'\0') {
      bVar1 = false;
      if (iVar14 < 1) {
        bVar15 = true;
      }
      else {
        uVar7 = (ulong)(uint)tag;
        lVar11 = 1;
        uVar13 = tag + L'\xffffd8ee';
        piVar9 = local_68;
        local_40 = name;
        local_4c = qual;
        do {
          iVar5 = piVar9[lVar11 + -1];
          if (((acls[iVar5].type == wVar3) && (acls[iVar5].permset == wVar2)) &&
             (acls[iVar5].tag == (wchar_t)uVar7)) {
            if (((uVar13 < 5) && ((0x15U >> (uVar13 & 0x1f) & 1) != 0)) ||
               ((wchar_t)uVar7 == L'❻')) {
LAB_001184cd:
              piVar9[lVar11 + -1] = piVar9[(long)iVar14 + -1];
              iVar14 = iVar14 + -1;
              bVar1 = true;
            }
            else if (acls[iVar5].qual == local_4c) {
              pcVar10 = acls[iVar5].name;
              if (local_40 == (char *)0x0) {
                if (pcVar10 == (char *)0x0) goto LAB_001184cd;
                bVar15 = *pcVar10 == '\0';
              }
              else if (pcVar10 == (char *)0x0) {
                bVar15 = *local_40 == '\0';
              }
              else {
                local_50 = uVar13;
                local_38 = uVar7;
                iVar5 = strcmp(local_40,pcVar10);
                bVar15 = iVar5 == 0;
                piVar9 = local_68;
                uVar7 = local_38;
                uVar13 = local_50;
              }
              if (bVar15) goto LAB_001184cd;
            }
          }
          bVar15 = !bVar1;
        } while ((lVar11 < iVar14) && (lVar11 = lVar11 + 1, !bVar1));
      }
      ae = local_70;
      want_type = local_80;
      uVar13 = type ^ 0x100;
      if (tag == L'✒' && uVar13 == 0) goto LAB_001185f9;
      if (tag == L'✔' && uVar13 == 0) {
        if (bVar15) {
          failure_start(file,line,"No match for group_obj perm");
          failure_finish((void *)0x0);
          local_94 = L'\x01';
        }
        uVar7 = (ulong)(uint)permset;
        ae = local_70;
        if (permset * 8 != local_58) {
          pcVar10 = "GROUP_OBJ permset (%02o) != group mode (%02o)";
          uVar12 = (ulong)local_60;
          goto LAB_00118701;
        }
      }
      else if (uVar13 == 0 && tag == L'✖') {
        if (bVar15) {
          failure_start(file,line,"No match for other perm");
          failure_finish((void *)0x0);
          local_94 = L'\x01';
        }
        uVar7 = (ulong)(uint)permset;
        ae = local_70;
        if (permset != local_84) {
          pcVar10 = "OTHER permset (%02o) != other mode (%02o)";
          uVar12 = (ulong)(uint)local_84;
          goto LAB_00118701;
        }
      }
      else if (!bVar1) {
        failure_start(file,line,
                      "Could not find match for ACL (type=%#010x,permset=%#010x,tag=%d,qual=%d,name=``%s\'\')"
                      ,(ulong)(uint)type,(ulong)(uint)permset,(ulong)(uint)tag,(ulong)(uint)qual,
                      name);
        goto LAB_00118708;
      }
    }
    if (wVar4 != L'\x01') {
      failure_start(file,line,"Should not exit before EOF");
      failure_finish((void *)0x0);
      local_94 = L'\x01';
    }
    if ((((uint)want_type >> 8 & 1) != 0) &&
       (mVar6 = archive_entry_mode(ae), ((mVar6 ^ mode) & 0x1ffU) != 0)) {
      mVar6 = archive_entry_mode(ae);
      failure_start(file,line,"Mode (%02o) and entry mode (%02o) mismatch",(ulong)(uint)mode,
                    (ulong)mVar6);
      failure_finish((void *)0x0);
      local_94 = L'\x01';
    }
    piVar9 = local_68;
    if (iVar14 != 0) {
      iVar14 = *local_68;
      failure_start(file,line,
                    "Could not find match for ACL (type=%#010x,permset=%#010x,tag=%d,qual=%d,name=``%s\'\')"
                    ,(ulong)(uint)acls[iVar14].type,(ulong)(uint)acls[iVar14].permset,
                    (ulong)(uint)acls[iVar14].tag,(ulong)(uint)acls[iVar14].qual,acls[iVar14].name);
      failure_finish((void *)0x0);
      local_94 = L'\x01';
    }
    free(piVar9);
  }
  return local_94;
LAB_001185f9:
  if (bVar15) {
    failure_start(file,line,"No match for user_obj perm");
    failure_finish((void *)0x0);
    local_94 = L'\x01';
  }
  uVar7 = (ulong)(uint)permset;
  ae = local_70;
  if (permset << 6 != local_54) {
    pcVar10 = "USER_OBJ permset (%02o) != user mode (%02o)";
    uVar12 = (ulong)local_5c;
LAB_00118701:
    ae = local_70;
    failure_start(file,line,pcVar10,uVar7,uVar12);
LAB_00118708:
    failure_finish((void *)0x0);
    local_94 = L'\x01';
  }
  goto LAB_0011842a;
}

Assistant:

int
assertion_entry_compare_acls(const char *file, int line,
    struct archive_entry *ae, struct archive_test_acl_t *acls, int cnt,
    int want_type, int mode)
{
	int *marker;
	int i, r, n, ret;
	int type, permset, tag, qual;
	int matched;
	const char *name;

	assertion_count(file, line);

	ret = 0;
	n = 0;
	marker = malloc(sizeof(marker[0]) * cnt);

	for (i = 0; i < cnt; i++) {
		if ((acls[i].type & want_type) != 0) {
			marker[n] = i;
			n++;
		}
	}

	if (n == 0) {
		failure_start(file, line, "No ACL's to compare, type mask: %d",
		    want_type);
		return (1);
	}

	while (0 == (r = archive_entry_acl_next(ae, want_type,
			 &type, &permset, &tag, &qual, &name))) {
		for (i = 0, matched = 0; i < n && !matched; i++) {
			if (archive_test_acl_match(&acls[marker[i]], type,
			    permset, tag, qual, name)) {
				/* We found a match; remove it. */
				marker[i] = marker[n - 1];
				n--;
				matched = 1;
			}
		}
		if (type == ARCHIVE_ENTRY_ACL_TYPE_ACCESS
		    && tag == ARCHIVE_ENTRY_ACL_USER_OBJ) {
			if (!matched) {
				failure_start(file, line, "No match for "
				    "user_obj perm");
				failure_finish(NULL);
				ret = 1;
			}
			if ((permset << 6) != (mode & 0700)) {
				failure_start(file, line, "USER_OBJ permset "
				    "(%02o) != user mode (%02o)",
				    (unsigned int)permset,
				    (unsigned int)(07 & (mode >> 6)));
				failure_finish(NULL);
				ret = 1;
			}
		} else if (type == ARCHIVE_ENTRY_ACL_TYPE_ACCESS
		    && tag == ARCHIVE_ENTRY_ACL_GROUP_OBJ) {
			if (!matched) {
				failure_start(file, line, "No match for "
				    "group_obj perm");
				failure_finish(NULL);
				ret = 1;
			}
			if ((permset << 3) != (mode & 0070)) {
				failure_start(file, line, "GROUP_OBJ permset "
				    "(%02o) != group mode (%02o)",
				    (unsigned int)permset,
				    (unsigned int)(07 & (mode >> 3)));
				failure_finish(NULL);
				ret = 1;
			}
		} else if (type == ARCHIVE_ENTRY_ACL_TYPE_ACCESS
		    && tag == ARCHIVE_ENTRY_ACL_OTHER) {
			if (!matched) {
				failure_start(file, line, "No match for "
				    "other perm");
				failure_finish(NULL);
				ret = 1;
			}
			if ((permset << 0) != (mode & 0007)) {
				failure_start(file, line, "OTHER permset "
				    "(%02o) != other mode (%02o)",
				    (unsigned int)permset,
				    (unsigned int)mode & 07);
				failure_finish(NULL);
				ret = 1;
			}
		} else if (matched != 1) {
			failure_start(file, line, "Could not find match for "
			    "ACL (type=%#010x,permset=%#010x,tag=%d,qual=%d,"
			    "name=``%s'')", (unsigned int)type,
			    (unsigned int)permset, tag, qual, name);
			failure_finish(NULL);
			ret = 1;
		}
	}
	if (r != ARCHIVE_EOF) {
		failure_start(file, line, "Should not exit before EOF");
		failure_finish(NULL);
		ret = 1;
	}
	if ((want_type & ARCHIVE_ENTRY_ACL_TYPE_ACCESS) != 0 &&
	    (mode_t)(mode & 0777) != (archive_entry_mode(ae) & 0777)) {
		failure_start(file, line, "Mode (%02o) and entry mode (%02o) "
		    "mismatch", (unsigned int)mode,
		    (unsigned int)archive_entry_mode(ae));
		failure_finish(NULL);
		ret = 1;
	}
	if (n != 0) {
		failure_start(file, line, "Could not find match for ACL "
		    "(type=%#010x,permset=%#010x,tag=%d,qual=%d,name=``%s'')",
		    (unsigned int)acls[marker[0]].type,
		    (unsigned int)acls[marker[0]].permset,
		    acls[marker[0]].tag, acls[marker[0]].qual,
		    acls[marker[0]].name);
		failure_finish(NULL);
		ret = 1;
		/* Number of ACLs not matched should == 0 */
	}
	free(marker);
	return (ret);
}